

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O2

string * __thiscall
ELFIO::dump::find_value_in_table<ELFIO::type_table_t[5],unsigned_short>
          (string *__return_storage_ptr__,dump *this,type_table_t (*table) [5],unsigned_short *key)

{
  dump *pdVar1;
  long lVar2;
  allocator<char> local_19;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"?",&local_19)
  ;
  lVar2 = 0;
  do {
    if (lVar2 + 0x10 == 0x60) {
      return __return_storage_ptr__;
    }
    pdVar1 = this + lVar2;
    lVar2 = lVar2 + 0x10;
  } while (*(Elf32_Half *)pdVar1 != (*table)[0].key);
  std::__cxx11::string::assign((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string static find_value_in_table( const T& table, const K& key )
    {
        std::string res = "?";
        for ( unsigned int i = 0; i < sizeof( table ) / sizeof( table[0] );
              ++i ) {
            if ( table[i].key == key ) {
                res = table[i].str;
                break;
            }
        }

        return res;
    }